

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ptexture.h
# Opt level: O1

void Ptex::v2_2::(anonymous_namespace)::Apply<float,4>
               (PtexSeparableKernel *k,float *result,void *data,int param_4,int param_5)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  byte bVar4;
  int iVar5;
  float *pfVar6;
  long lVar7;
  float *pfVar8;
  float *pfVar9;
  int iVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  bVar4 = (k->res).ulog2;
  iVar10 = 4 << (bVar4 & 0x1f);
  lVar7 = (long)iVar10 * (long)k->vw;
  if ((int)lVar7 != 0) {
    pfVar9 = (float *)((long)data + ((long)(k->v << (bVar4 & 0x1f)) + (long)k->u) * 0x10);
    pfVar1 = pfVar9 + lVar7;
    pfVar8 = k->kv;
    iVar5 = k->uw;
    pfVar6 = k->ku;
    do {
      fVar15 = *pfVar6;
      fVar12 = fVar15 * *pfVar9;
      fVar13 = fVar15 * pfVar9[1];
      fVar14 = fVar15 * pfVar9[2];
      fVar15 = fVar15 * pfVar9[3];
      if (iVar5 != 1) {
        lVar11 = 4;
        lVar7 = 0;
        do {
          pfVar2 = pfVar9 + lVar11;
          fVar3 = *(float *)((long)pfVar6 + lVar11);
          fVar12 = fVar12 + fVar3 * *pfVar2;
          fVar13 = fVar13 + fVar3 * pfVar2[1];
          fVar14 = fVar14 + fVar3 * pfVar2[2];
          fVar15 = fVar15 + fVar3 * pfVar2[3];
          lVar7 = lVar7 + -0x10;
          lVar11 = lVar11 + 4;
        } while ((long)(iVar5 * 4) * -4 + 0x10 != lVar7);
        pfVar9 = (float *)((long)pfVar9 - lVar7);
      }
      fVar3 = *pfVar8;
      pfVar8 = pfVar8 + 1;
      *result = fVar3 * fVar12 + *result;
      result[1] = fVar3 * fVar13 + result[1];
      result[2] = fVar3 * fVar14 + result[2];
      result[3] = fVar3 * fVar15 + result[3];
      pfVar9 = pfVar9 + (long)(iVar10 + iVar5 * -4) + 4;
    } while (pfVar9 != pfVar1);
  }
  return;
}

Assistant:

int u() const { return 1<<(unsigned)ulog2; }